

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

int __thiscall particleSamples::read_in_particle_samples_OSCAR_mixed_event(particleSamples *this)

{
  uint uVar1;
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_00;
  istream *piVar2;
  int iVar3;
  int local_3f4;
  int local_3f0;
  int temp_monval;
  int n_particle;
  int dummy;
  int event_id;
  string temp_string;
  particle_info temp_particle_info;
  stringstream temp2;
  stringstream temp1;
  
  clear_out_previous_record(this,this->full_particle_list_mixed_event);
  temp_string._M_dataplus._M_p = (pointer)&temp_string.field_2;
  temp_string._M_string_length = 0;
  temp_string.field_2._M_local_buf[0] = '\0';
  local_3f4 = 0;
  local_3f0 = 0;
  do {
    if (this->event_buffer_size <= local_3f0) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&this->inputfile_mixed_event,(string *)&temp_string);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&temp1,(string *)&temp_string,_S_out|_S_in);
    piVar2 = (istream *)std::istream::operator>>((istream *)&temp1,&event_id);
    std::istream::operator>>(piVar2,&n_particle);
    uVar1 = *(uint *)(&this->field_0x3f0 + *(long *)(*(long *)&this->inputfile_mixed_event + -0x18))
    ;
    if ((uVar1 & 2) == 0) {
      this_00 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                 *)this->full_particle_list_mixed_event;
      _temp2 = (undefined8 *)operator_new(0x18);
      *_temp2 = 0;
      _temp2[1] = 0;
      _temp2[2] = 0;
      std::
      vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
      ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>
                (this_00,(vector<particle_info,_std::allocator<particle_info>_> **)&temp2);
      iVar3 = 0;
      while( true ) {
        if (n_particle <= iVar3) break;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&this->inputfile_mixed_event,(string *)&temp_string);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&temp2,(string *)&temp_string,_S_out|_S_in);
        piVar2 = (istream *)std::istream::operator>>((istream *)&temp2,&dummy);
        std::istream::operator>>(piVar2,&temp_monval);
        temp_particle_info.monval = temp_monval;
        piVar2 = std::istream::_M_extract<double>((double *)&temp2);
        piVar2 = std::istream::_M_extract<double>((double *)piVar2);
        piVar2 = std::istream::_M_extract<double>((double *)piVar2);
        piVar2 = std::istream::_M_extract<double>((double *)piVar2);
        piVar2 = std::istream::_M_extract<double>((double *)piVar2);
        piVar2 = std::istream::_M_extract<double>((double *)piVar2);
        piVar2 = std::istream::_M_extract<double>((double *)piVar2);
        piVar2 = std::istream::_M_extract<double>((double *)piVar2);
        std::istream::_M_extract<double>((double *)piVar2);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((this->full_particle_list_mixed_event->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_3f4],&temp_particle_info);
        std::__cxx11::stringstream::~stringstream((stringstream *)&temp2);
        iVar3 = iVar3 + 1;
      }
      local_3f0 = local_3f0 + n_particle;
      local_3f4 = local_3f4 + 1;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&temp1);
  } while ((uVar1 & 2) == 0);
  std::__cxx11::string::~string((string *)&temp_string);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_OSCAR_mixed_event() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list_mixed_event);

    std::string temp_string;
    int event_id, n_particle, dummy;
    int ievent = 0;
    int temp_monval;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        getline(inputfile_mixed_event, temp_string);
        std::stringstream temp1(temp_string);
        temp1 >> event_id >> n_particle;

        if (inputfile_mixed_event.eof()) break;

        full_particle_list_mixed_event->push_back(new vector<particle_info>);
        for (int ipart = 0; ipart < n_particle; ipart++) {
            getline(inputfile_mixed_event, temp_string);
            std::stringstream temp2(temp_string);
            temp2 >> dummy >> temp_monval;
            particle_info temp_particle_info;
            temp_particle_info.monval = temp_monval;
            temp2 >> temp_particle_info.px >> temp_particle_info.py
                >> temp_particle_info.pz >> temp_particle_info.E
                >> temp_particle_info.mass >> temp_particle_info.x
                >> temp_particle_info.y >> temp_particle_info.z
                >> temp_particle_info.t;
            (*full_particle_list_mixed_event)[ievent]->push_back(
                temp_particle_info);
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}